

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void setAttribute_internal(WidgetAttribute attribute,bool on,QWidgetData *data,QWidgetPrivate *d)

{
  byte bVar1;
  int iVar2;
  int int_off;
  int x;
  QWidgetPrivate *d_local;
  QWidgetData *data_local;
  bool on_local;
  WidgetAttribute attribute_local;
  
  if ((int)attribute < 0x20) {
    if (on) {
      data->widget_attributes = 1 << ((byte)attribute & 0x1f) | data->widget_attributes;
    }
    else {
      data->widget_attributes =
           (1 << ((byte)attribute & 0x1f) ^ 0xffffffffU) & data->widget_attributes;
    }
  }
  else {
    iVar2 = (int)((ulong)(long)(int)(attribute - WA_ForceDisabled) >> 5);
    bVar1 = (byte)(attribute - WA_ForceDisabled);
    if (on) {
      d->high_attributes[iVar2] = 1 << (bVar1 & 0x1f) | d->high_attributes[iVar2];
    }
    else {
      d->high_attributes[iVar2] = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & d->high_attributes[iVar2];
    }
  }
  return;
}

Assistant:

static void setAttribute_internal(Qt::WidgetAttribute attribute, bool on, QWidgetData *data,
                                  QWidgetPrivate *d)
{
    if (attribute < int(8*sizeof(uint))) {
        if (on)
            data->widget_attributes |= (1<<attribute);
        else
            data->widget_attributes &= ~(1<<attribute);
    } else {
        const int x = attribute - 8*sizeof(uint);
        const int int_off = x / (8*sizeof(uint));
        if (on)
            d->high_attributes[int_off] |= (1<<(x-(int_off*8*sizeof(uint))));
        else
            d->high_attributes[int_off] &= ~(1<<(x-(int_off*8*sizeof(uint))));
    }
}